

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O0

int oldstyle_hostline(LIBSSH2_KNOWNHOSTS *hosts,char *host,size_t hostlen,char *key_type_name,
                     size_t key_type_len,char *key,size_t keylen,int key_type,char *comment,
                     size_t commentlen)

{
  int iVar1;
  char *__src;
  char local_168;
  char acStack_167 [7];
  char hostbuf [256];
  char *local_60;
  char *name;
  size_t namelen;
  int rc;
  char *key_local;
  size_t key_type_len_local;
  char *key_type_name_local;
  size_t hostlen_local;
  char *host_local;
  LIBSSH2_KNOWNHOSTS *hosts_local;
  
  name = (char *)0x0;
  __src = host + hostlen;
  if (hostlen == 0) {
    hosts_local._4_4_ =
         _libssh2_error(hosts->session,-0x21,"Failed to parse known_hosts line (no host names)");
  }
  else {
    while (local_60 = __src, host < local_60) {
      __src = local_60 + -1;
      name = name + 1;
      if ((__src == host) || (local_60[-2] == ',')) {
        if ((char *)0xfe < name) {
          iVar1 = _libssh2_error(hosts->session,-0x21,
                                 "Failed to parse known_hosts line (unexpected length)");
          return iVar1;
        }
        memcpy(&local_168,__src,(size_t)name);
        (&local_168)[(long)name] = '\0';
        iVar1 = knownhost_add(hosts,&local_168,(char *)0x0,key_type_name,key_type_len,key,keylen,
                              comment,commentlen,key_type | 0x20001,(libssh2_knownhost **)0x0);
        if (iVar1 != 0) {
          return iVar1;
        }
        if (host < __src) {
          name = (char *)0x0;
          __src = local_60 + -2;
        }
      }
    }
    hosts_local._4_4_ = 0;
  }
  return hosts_local._4_4_;
}

Assistant:

static int oldstyle_hostline(LIBSSH2_KNOWNHOSTS *hosts,
                             const char *host, size_t hostlen,
                             const char *key_type_name, size_t key_type_len,
                             const char *key, size_t keylen, int key_type,
                             const char *comment, size_t commentlen)
{
    int rc = 0;
    size_t namelen = 0;
    const char *name = host + hostlen;

    if(hostlen < 1)
        return _libssh2_error(hosts->session,
                              LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                              "Failed to parse known_hosts line "
                              "(no host names)");

    while(name > host) {
        --name;
        ++namelen;

        /* when we get the the start or see a comma coming up, add the host
           name to the collection */
        if((name == host) || (*(name-1) == ',')) {

            char hostbuf[256];

            /* make sure we don't overflow the buffer */
            if(namelen >= sizeof(hostbuf)-1)
                return _libssh2_error(hosts->session,
                                      LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                                      "Failed to parse known_hosts line "
                                      "(unexpected length)");

            /* copy host name to the temp buffer and zero terminate */
            memcpy(hostbuf, name, namelen);
            hostbuf[namelen] = 0;

            rc = knownhost_add(hosts, hostbuf, NULL,
                               key_type_name, key_type_len,
                               key, keylen,
                               comment, commentlen,
                               key_type | LIBSSH2_KNOWNHOST_TYPE_PLAIN |
                               LIBSSH2_KNOWNHOST_KEYENC_BASE64, NULL);
            if(rc)
                return rc;

            if(name > host) {
                namelen = 0;
                --name; /* skip comma */
            }
        }
    }

    return rc;
}